

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O3

int __thiscall
smf::Binasc::getWord(Binasc *this,string *word,string *input,string *terminators,int index)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  
  bVar2 = false;
  std::__cxx11::string::resize((ulong)word,'\0');
  lVar4 = std::__cxx11::string::find((char)terminators,0x22);
  iVar6 = (int)input->_M_string_length;
  if (index < iVar6) {
    do {
      pcVar1 = (input->_M_dataplus)._M_p;
      if (lVar4 == -1) {
LAB_0011d966:
        lVar5 = std::__cxx11::string::find((char)terminators,(ulong)(uint)(int)pcVar1[index]);
        if (lVar5 != -1) {
          return index + 1;
        }
        std::__cxx11::string::push_back((char)word);
        index = index + 1;
      }
      else {
        bVar3 = bVar2;
        if (pcVar1[index] == '\"') {
          index = index + 1;
          bVar3 = true;
          if (bVar2) {
            return index;
          }
        }
        bVar2 = bVar3;
        if (((iVar6 + -1 <= index) || (pcVar1[index] != '\\')) || (pcVar1[(long)index + 1] != '\"'))
        goto LAB_0011d966;
        std::__cxx11::string::push_back((char)word);
        index = index + 2;
      }
      iVar6 = (int)input->_M_string_length;
    } while (index < iVar6);
  }
  return index;
}

Assistant:

int Binasc::getWord(std::string& word, const std::string& input,
		const std::string& terminators, int index) {
	word.resize(0);
	int i = index;
	int escape = 0;
	int ecount = 0;
	if (terminators.find('"') != std::string::npos) {
		escape = 1;
	}
	while (i < (int)input.size()) {
		if (escape && input[i] == '\"') {
			ecount++;
			i++;
			if (ecount >= 2) {
				break;
			}
		}
		if (escape && (i<(int)input.size()-1) && (input[i] == '\\')
				&& (input[i+1] == '"')) {
			word.push_back(input[i+1]);
			i += 2;
		} else if (terminators.find(input[i]) == std::string::npos) {
			word.push_back(input[i]);
			i++;
		} else {
			i++;
			return i;
		}
	}
	return i;
}